

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

ostream * Omega_h::operator<<(ostream *os,FiniteAutomaton *fa)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int token;
  int next_state_1;
  int symbol_1;
  int next_state;
  int symbol;
  int state;
  FiniteAutomaton *fa_local;
  ostream *os_local;
  
  bVar1 = get_determinism(fa);
  if (bVar1) {
    std::operator<<(os,"dfa ");
  }
  else {
    std::operator<<(os,"nfa ");
  }
  iVar2 = get_nstates(fa);
  poVar4 = (ostream *)std::ostream::operator<<(os,iVar2);
  poVar4 = std::operator<<(poVar4," states ");
  iVar2 = get_nsymbols(fa);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4," symbols\n");
  for (next_state = 0; iVar2 = get_nstates(fa), next_state < iVar2; next_state = next_state + 1) {
    for (symbol_1 = 0; iVar2 = get_nsymbols(fa), symbol_1 < iVar2; symbol_1 = symbol_1 + 1) {
      iVar2 = step(fa,next_state,symbol_1);
      if (iVar2 != -1) {
        poVar4 = std::operator<<(os,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,next_state);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,symbol_1);
        poVar4 = std::operator<<(poVar4,") -> ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::operator<<(poVar4,'\n');
      }
    }
    bVar1 = get_determinism(fa);
    if (!bVar1) {
      for (token = get_epsilon0(fa); iVar2 = get_epsilon1(fa), token <= iVar2; token = token + 1) {
        iVar2 = step(fa,next_state,token);
        if (iVar2 != -1) {
          poVar4 = std::operator<<(os,"(");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,next_state);
          poVar4 = std::operator<<(poVar4,", eps");
          iVar3 = get_epsilon0(fa);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,token - iVar3);
          poVar4 = std::operator<<(poVar4,") -> ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
          std::operator<<(poVar4,'\n');
        }
      }
    }
    iVar2 = accepts(fa,next_state);
    if (iVar2 != -1) {
      poVar4 = (ostream *)std::ostream::operator<<(os,next_state);
      poVar4 = std::operator<<(poVar4," accepts ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::operator<<(poVar4,'\n');
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, FiniteAutomaton const& fa) {
  if (get_determinism(fa))
    os << "dfa ";
  else
    os << "nfa ";
  os << get_nstates(fa) << " states " << get_nsymbols(fa) << " symbols\n";
  for (int state = 0; state < get_nstates(fa); ++state) {
    for (int symbol = 0; symbol < get_nsymbols(fa); ++symbol) {
      auto next_state = step(fa, state, symbol);
      if (next_state != -1)
        os << "(" << state << ", " << symbol << ") -> " << next_state << '\n';
    }
    if (!get_determinism(fa)) {
      for (int symbol = get_epsilon0(fa); symbol <= get_epsilon1(fa);
           ++symbol) {
        auto next_state = step(fa, state, symbol);
        if (next_state != -1)
          os << "(" << state << ", eps" << (symbol - get_epsilon0(fa))
             << ") -> " << next_state << '\n';
      }
    }
    auto token = accepts(fa, state);
    if (token != -1) os << state << " accepts " << token << '\n';
  }
  return os;
}